

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall
leveldb::CorruptionTest_TableFileRepair_Test::~CorruptionTest_TableFileRepair_Test
          (CorruptionTest_TableFileRepair_Test *this)

{
  CorruptionTest_TableFileRepair_Test *this_local;
  
  ~CorruptionTest_TableFileRepair_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(CorruptionTest, TableFileRepair) {
  options_.block_size = 2 * kValueSize;  // Limit scope of corruption
  options_.paranoid_checks = true;
  Reopen();
  Build(100);
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();
  dbi->TEST_CompactRange(0, nullptr, nullptr);
  dbi->TEST_CompactRange(1, nullptr, nullptr);

  Corrupt(kTableFile, 100, 1);
  RepairDB();
  Reopen();
  Check(95, 99);
}